

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall AlternativeLoader::~AlternativeLoader(AlternativeLoader *this)

{
  string *this_00;
  
  this_00 = this->pDominationMapFile;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
  }
  operator_delete(this_00,0x20);
  return;
}

Assistant:

AlternativeLoader::~AlternativeLoader() {
    delete pDominationMapFile;
}